

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O1

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::readVariable
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this,Mapping *m,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  long *plVar4;
  ulong *puVar5;
  ExpectedRef<const_Value,_std::string> value_result;
  ulong *local_c0;
  ulong local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong *local_80;
  undefined8 local_78;
  ulong local_70;
  long lStack_68;
  undefined1 local_60 [32];
  char local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  yaml::Mapping::getValue
            ((ExpectedRef<const_Value,_std::string> *)
             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_60)->value_,m,name);
  if (local_40 == '\0') {
    std::operator+(&local_38,"Cannot read variable ",name);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_90 = *plVar4;
      uStack_88 = (undefined4)plVar3[3];
      uStack_84 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar4;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_40 == '\x01') {
      aAppDebugPrintf("[CRASH] Expected has value");
      aAppTerminate(-1);
    }
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,local_60._0_8_);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_b0 = *puVar5;
      lStack_a8 = plVar3[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar5;
      local_c0 = (ulong *)*plVar3;
    }
    local_70 = local_b0;
    sVar2 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_c0 == &local_b0) {
      lStack_68 = lStack_a8;
      local_80 = &local_70;
    }
    else {
      local_80 = local_c0;
    }
    local_b0 = local_b0 & 0xffffffffffffff00;
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    (__return_storage_ptr__->field_0).value_ = (long)paVar1;
    if (local_80 == &local_70) {
      paVar1->_M_allocated_capacity = local_70;
      *(long *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = lStack_68;
    }
    else {
      (__return_storage_ptr__->field_0).value_ = (long)local_80;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_70;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar2;
    local_70 = local_70 & 0xffffffffffffff00;
    __return_storage_ptr__->has_value_ = false;
    local_78 = 0;
    local_80 = &local_70;
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    yaml::Value::getInt_abi_cxx11_(__return_storage_ptr__,(Value *)local_60._0_8_);
  }
  if ((local_40 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_60)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> readVariable(const yaml::Mapping &m, const std::string &name) {
		auto value_result = m.getValue(name);
		if (!value_result)
			return Unexpected("Cannot read variable " + name + ": " + value_result.error());
		// FIXME read actual variable
		return value_result.value().get().getInt();
	}